

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<double,_1,_0>::calcStatesStatesFixedScaling
          (BeagleCPU4StateImpl<double,_1,_0> *this,double *destP,int *states1,double *matrices1,
          int *states2,double *matrices2,double *scaleFactors,int startPattern,int endPattern)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  double scaleFactor;
  int state2;
  int state1;
  int k;
  int w;
  int v;
  int l;
  double *matrices2_local;
  int *states2_local;
  double *matrices1_local;
  int *states1_local;
  double *destP_local;
  BeagleCPU4StateImpl<double,_1,_0> *this_local;
  
  for (l = 0; l < (this->super_BeagleCPUImpl<double,_1,_0>).kCategoryCount; l = l + 1) {
    v = l * 4 * (this->super_BeagleCPUImpl<double,_1,_0>).kPaddedPatternCount;
    if (startPattern != 0) {
      v = startPattern * 4 + v;
    }
    iVar4 = l * 0x14;
    for (k = startPattern; k < endPattern; k = k + 1) {
      iVar2 = states1[k];
      iVar3 = states2[k];
      dVar1 = scaleFactors[k];
      destP[v] = (matrices1[iVar4 + iVar2] * matrices2[iVar4 + iVar3]) / dVar1;
      destP[v + 1] = (matrices1[iVar4 + 5 + iVar2] * matrices2[iVar4 + 5 + iVar3]) / dVar1;
      destP[v + 2] = (matrices1[iVar4 + 10 + iVar2] * matrices2[iVar4 + 10 + iVar3]) / dVar1;
      destP[v + 3] = (matrices1[iVar4 + 0xf + iVar2] * matrices2[iVar4 + 0xf + iVar3]) / dVar1;
      v = v + 4;
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcStatesStatesFixedScaling(REALTYPE* destP,
                                                                           const int* states1,
                                                                           const REALTYPE* matrices1,
                                                                           const int* states2,
                                                                           const REALTYPE* matrices2,
                                                                           const REALTYPE* scaleFactors,
                                                                           int startPattern,
                                                                           int endPattern) {

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int v = l*4*kPaddedPatternCount;
        if (startPattern != 0) {
          v += 4*startPattern;
        }

        int w = l*4*OFFSET;

        for (int k = startPattern; k < endPattern; k++) {

            const int state1 = states1[k];
            const int state2 = states2[k];
            const REALTYPE scaleFactor = scaleFactors[k];

            destP[v    ] = matrices1[w            + state1] *
                           matrices2[w            + state2] / scaleFactor;
            destP[v + 1] = matrices1[w + OFFSET*1 + state1] *
                           matrices2[w + OFFSET*1 + state2] / scaleFactor;
            destP[v + 2] = matrices1[w + OFFSET*2 + state1] *
                           matrices2[w + OFFSET*2 + state2] / scaleFactor;
            destP[v + 3] = matrices1[w + OFFSET*3 + state1] *
                           matrices2[w + OFFSET*3 + state2] / scaleFactor;
            v += 4;
        }
    }
}